

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicFixedWingAircraft.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft
          (GED_BasicFixedWingAircraft *this)

{
  long lVar1;
  
  DataTypeBase::DataTypeBase((DataTypeBase *)this);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicFixedWingAircraft_0022a890;
  this->m_ui16EntityID = 0;
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EA);
  *(undefined1 *)((long)&this->m_i16Spd + 1) = 0;
  *(undefined4 *)&this->m_ui8FuelStatus = 0;
  lVar1 = -3;
  do {
    this->m_i16Offsets[lVar1 + 3] = 0;
    this->m_i8Ori[lVar1 + 3] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  return;
}

Assistant:

GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft() :
    m_ui16EntityID( 0 ),
    m_ui8FuelStatus( 0 ),
    m_i8HoriDevi( 0 ),
    m_i8VertDevi( 0 ),
    m_i16Spd( 0 )
{
    for( KINT8 i = 0; i < 3; ++i )
    {
        m_i16Offsets[i] = 0;
        m_i8Ori[i] = 0;
    }
}